

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

void Abc_NtkBalanceLevel(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_1c;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtk_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = Abc_NtkObj(pNtk,local_1c);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xfff;
    }
  }
  for (local_1c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = Abc_NtkCo(pNtk,local_1c);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    Abc_NtkBalanceLevel_rec(pAVar2);
  }
  return;
}

Assistant:

void Abc_NtkBalanceLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i;
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->Level = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_NtkBalanceLevel_rec( Abc_ObjFanin0(pNode) );
}